

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.cpp
# Opt level: O1

bool EncoderMD::SetsConditionCode(Instr *instr)

{
  bool bVar1;
  
  if (instr->m_opcode < ADD) {
    bVar1 = false;
  }
  else {
    bVar1 = (bool)(((byte)Opdope[instr->m_opcode - 0x3d5] & 2) >> 1);
  }
  return bVar1;
}

Assistant:

bool EncoderMD::SetsConditionCode(IR::Instr *instr)
{
    return instr->IsLowered() && (EncoderMD::GetOpdope(instr) & DSETCC);
}